

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  int iVar1;
  int iVar3;
  Finder *pFVar2;
  bool bVar4;
  bool bVar5;
  __type_conflict _Var6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Descriptor *pDVar8;
  Descriptor *pDVar9;
  OneofDescriptor *oneof_descriptor;
  FieldDescriptor *pFVar10;
  MessageFactory *factory;
  MessageLite *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Reflection *this_01;
  string *psVar12;
  string_view str;
  string_view name;
  string_view name_00;
  string_view lowercase_name;
  string_view name_01;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view data;
  Metadata MVar13;
  ParseLocationRange range;
  char (*in_stack_fffffffffffffdf8) [3];
  string lower_field_name;
  string prefix_and_full_type_name;
  string field_name;
  AlphaNum local_188;
  string full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  string serialized_value;
  string prefix;
  AlphaNum local_c0;
  string local_90;
  string local_70;
  char *local_50;
  char *local_48;
  undefined4 extraout_var_02;
  
  MVar13 = Message::GetMetadata(message);
  this_01 = MVar13.reflection;
  MVar13 = Message::GetMetadata(message);
  pDVar9 = MVar13.descriptor;
  paVar11 = &field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  iVar1 = (this->tokenizer_).current_.line;
  iVar3 = (this->tokenizer_).current_.column;
  range.start.column = iVar3;
  range.start.line = iVar1;
  field_name._M_dataplus._M_p = (pointer)paVar11;
  bVar4 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lower_field_name,"[",(allocator<char> *)&local_188);
    bVar4 = TryConsume(this,&lower_field_name);
    std::__cxx11::string::~string((string *)&lower_field_name);
    if (bVar4) {
      full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
      full_type_name._M_string_length = 0;
      full_type_name.field_2._M_local_buf[0] = '\0';
      prefix._M_string_length = 0;
      prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
      prefix.field_2._M_local_buf[0] = '\0';
      bVar4 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
      if (bVar4) {
        lower_field_name._M_string_length = (size_type)prefix._M_dataplus._M_p;
        lower_field_name._M_dataplus._M_p = (pointer)prefix._M_string_length;
        local_188.piece_._M_len = full_type_name._M_string_length;
        local_188.piece_._M_str = full_type_name._M_dataplus._M_p;
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)&prefix_and_full_type_name,(AlphaNum *)&lower_field_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lower_field_name,"]",(allocator<char> *)&local_188);
        bVar4 = ConsumeBeforeWhitespace(this,&lower_field_name);
        std::__cxx11::string::~string((string *)&lower_field_name);
        if (bVar4) {
          TryConsumeWhitespace(this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lower_field_name,":",(allocator<char> *)&local_188);
          bVar4 = TryConsumeBeforeWhitespace(this,&lower_field_name);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (bVar4) {
            TryConsumeWhitespace(this);
          }
          paVar11 = &serialized_value.field_2;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          pFVar2 = this->finder_;
          serialized_value._M_dataplus._M_p = (pointer)paVar11;
          if (pFVar2 == (Finder *)0x0) {
            pDVar9 = anon_unknown_1::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
          }
          else {
            iVar7 = (*pFVar2->_vptr_Finder[4])(pFVar2,message,&prefix,&full_type_name);
            pDVar9 = (Descriptor *)CONCAT44(extraout_var,iVar7);
          }
          if (pDVar9 == (Descriptor *)0x0) {
            lower_field_name._0_16_ =
                 absl::lts_20240722::NullSafeStringView("Could not find type \"");
            local_188.piece_._M_len = prefix_and_full_type_name._M_string_length;
            local_188.piece_._M_str = prefix_and_full_type_name._M_dataplus._M_p;
            local_c0.piece_ =
                 absl::lts_20240722::NullSafeStringView("\" stored in google.protobuf.Any.");
            absl::lts_20240722::StrCat_abi_cxx11_
                      ((AlphaNum *)&local_50,(AlphaNum *)&lower_field_name,&local_188);
            message_02._M_str = local_50;
            message_02._M_len = (size_t)local_48;
            ReportError(this,message_02);
            std::__cxx11::string::~string((string *)&local_50);
LAB_002c8a74:
            bVar4 = false;
          }
          else {
            bVar4 = ConsumeAnyValue(this,pDVar9,&serialized_value);
            if (!bVar4) goto LAB_002c8a74;
            if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
               (((bVar4 = FieldDescriptor::is_repeated(any_type_url_field), !bVar4 &&
                 (bVar4 = Reflection::HasField(this_01,message,any_type_url_field), bVar4)) ||
                ((bVar4 = FieldDescriptor::is_repeated(any_value_field), !bVar4 &&
                 (bVar4 = Reflection::HasField(this_01,message,any_value_field), bVar4)))))) {
              message_01._M_str = "Non-repeated Any specified multiple times.";
              message_01._M_len = 0x2a;
              ReportError(this,message_01);
              goto LAB_002c8a74;
            }
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prefix_and_full_type_name._M_dataplus._M_p == &prefix_and_full_type_name.field_2)
            {
              local_70.field_2._8_8_ = prefix_and_full_type_name.field_2._8_8_;
            }
            else {
              local_70._M_dataplus._M_p = prefix_and_full_type_name._M_dataplus._M_p;
            }
            local_70._M_string_length = prefix_and_full_type_name._M_string_length;
            prefix_and_full_type_name._M_string_length = 0;
            prefix_and_full_type_name.field_2._M_local_buf[0] = '\0';
            prefix_and_full_type_name._M_dataplus._M_p = (pointer)&prefix_and_full_type_name.field_2
            ;
            Reflection::SetString(this_01,message,any_type_url_field,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)serialized_value._M_dataplus._M_p == paVar11) {
              local_90.field_2._8_8_ = serialized_value.field_2._8_8_;
            }
            else {
              local_90._M_dataplus._M_p = serialized_value._M_dataplus._M_p;
            }
            local_90.field_2._M_allocated_capacity._1_7_ =
                 serialized_value.field_2._M_allocated_capacity._1_7_;
            local_90.field_2._M_local_buf[0] = serialized_value.field_2._M_local_buf[0];
            local_90._M_string_length = serialized_value._M_string_length;
            serialized_value._M_string_length = 0;
            serialized_value.field_2._M_local_buf[0] = '\0';
            serialized_value._M_dataplus._M_p = (pointer)paVar11;
            Reflection::SetString(this_01,message,any_value_field,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            bVar4 = true;
          }
          std::__cxx11::string::~string((string *)&serialized_value);
        }
        else {
          bVar4 = false;
        }
        std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
      }
      else {
        bVar4 = false;
      }
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&full_type_name);
      goto LAB_002c93de;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lower_field_name,"[",(allocator<char> *)&local_188);
  bVar4 = TryConsume(this,&lower_field_name);
  std::__cxx11::string::~string((string *)&lower_field_name);
  if (bVar4) {
    bVar4 = ConsumeFullTypeName(this,&field_name);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,"]",(allocator<char> *)&local_188);
      bVar4 = ConsumeBeforeWhitespace(this,&lower_field_name);
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (bVar4) {
        TryConsumeWhitespace(this);
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          pFVar10 = anon_unknown_1::DefaultFinderFindExtension(message,&field_name);
        }
        else {
          iVar7 = (*pFVar2->_vptr_Finder[2])(pFVar2,message,&field_name);
          pFVar10 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar7);
        }
        if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_002c8ad1;
        if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
          lower_field_name._0_16_ = absl::lts_20240722::NullSafeStringView("Ignoring extension \"");
          local_188.piece_._M_len = field_name._M_string_length;
          local_188.piece_._M_str = field_name._M_dataplus._M_p;
          local_c0.piece_ =
               absl::lts_20240722::NullSafeStringView
                         ("\" which is not defined or is not an extension of \"");
          full_type_name._M_string_length = (size_type)pDVar9->all_names_[1]._M_dataplus._M_p;
          full_type_name._M_dataplus._M_p = (pointer)pDVar9->all_names_[1]._M_string_length;
          prefix._0_16_ = absl::lts_20240722::NullSafeStringView("\".");
          absl::lts_20240722::StrCat<>
                    (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_188,&local_c0,
                     (AlphaNum *)&full_type_name,(AlphaNum *)&prefix);
          message_00._M_str = prefix_and_full_type_name._M_dataplus._M_p;
          message_00._M_len = prefix_and_full_type_name._M_string_length;
          ReportWarning(this,message_00);
          goto LAB_002c905b;
        }
        lower_field_name._0_16_ = absl::lts_20240722::NullSafeStringView("Extension \"");
        local_188.piece_._M_len = field_name._M_string_length;
        local_188.piece_._M_str = field_name._M_dataplus._M_p;
        local_c0.piece_ =
             absl::lts_20240722::NullSafeStringView
                       ("\" is not defined or is not an extension of \"");
        full_type_name._M_string_length = (size_type)pDVar9->all_names_[1]._M_dataplus._M_p;
        full_type_name._M_dataplus._M_p = (pointer)pDVar9->all_names_[1]._M_string_length;
        prefix._0_16_ = absl::lts_20240722::NullSafeStringView("\".");
        absl::lts_20240722::StrCat<>
                  (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_188,&local_c0,
                   (AlphaNum *)&full_type_name,(AlphaNum *)&prefix);
        message_08._M_str = prefix_and_full_type_name._M_dataplus._M_p;
        message_08._M_len = prefix_and_full_type_name._M_string_length;
        ReportError(this,message_08);
LAB_002c92c2:
        psVar12 = &prefix_and_full_type_name;
LAB_002c92c7:
        std::__cxx11::string::~string((string *)psVar12);
      }
    }
LAB_002c92cc:
    bVar4 = false;
  }
  else {
    bVar4 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
    if (!bVar4) goto LAB_002c92cc;
    TryConsumeWhitespace(this);
    if ((this->allow_field_number_ == true) &&
       (str._M_str = (char *)&serialized_value, str._M_len = (size_t)field_name._M_dataplus._M_p,
       bVar4 = absl::lts_20240722::SimpleAtoi<int>
                         ((lts_20240722 *)field_name._M_string_length,str,
                          (Nonnull<int_*>)paVar11->_M_local_buf), bVar4)) {
      bVar4 = Descriptor::IsExtensionNumber(pDVar9,(int)serialized_value._M_dataplus._M_p);
      if (bVar4) {
        pFVar2 = this->finder_;
        if (pFVar2 == (Finder *)0x0) {
          pFVar10 = anon_unknown_1::DefaultFinderFindExtensionByNumber
                              (pDVar9,(int)serialized_value._M_dataplus._M_p);
        }
        else {
          iVar7 = (*pFVar2->_vptr_Finder[3])(pFVar2,pDVar9);
          pFVar10 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar7);
        }
LAB_002c8ac5:
        if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_002c8ad1;
LAB_002c8fa1:
        if (this->allow_unknown_field_ == false) {
          lower_field_name._0_16_ = absl::lts_20240722::NullSafeStringView("Message type \"");
          local_188.piece_._M_str = pDVar9->all_names_[1]._M_dataplus._M_p;
          local_188.piece_._M_len = pDVar9->all_names_[1]._M_string_length;
          local_c0.piece_ = absl::lts_20240722::NullSafeStringView("\" has no field named \"");
          full_type_name._M_dataplus._M_p = (pointer)field_name._M_string_length;
          full_type_name._M_string_length = (size_type)field_name._M_dataplus._M_p;
          prefix._0_16_ = absl::lts_20240722::NullSafeStringView("\".");
          absl::lts_20240722::StrCat<>
                    (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_188,&local_c0,
                     (AlphaNum *)&full_type_name,(AlphaNum *)&prefix);
          message_07._M_str = prefix_and_full_type_name._M_dataplus._M_p;
          message_07._M_len = prefix_and_full_type_name._M_string_length;
          ReportError(this,message_07);
          goto LAB_002c92c2;
        }
        lower_field_name._0_16_ = absl::lts_20240722::NullSafeStringView("Message type \"");
        local_188.piece_._M_str = pDVar9->all_names_[1]._M_dataplus._M_p;
        local_188.piece_._M_len = pDVar9->all_names_[1]._M_string_length;
        local_c0.piece_ = absl::lts_20240722::NullSafeStringView("\" has no field named \"");
        full_type_name._M_dataplus._M_p = (pointer)field_name._M_string_length;
        full_type_name._M_string_length = (size_type)field_name._M_dataplus._M_p;
        prefix._0_16_ = absl::lts_20240722::NullSafeStringView("\".");
        absl::lts_20240722::StrCat<>
                  (&prefix_and_full_type_name,(AlphaNum *)&lower_field_name,&local_188,&local_c0,
                   (AlphaNum *)&full_type_name,(AlphaNum *)&prefix);
        message_06._M_str = prefix_and_full_type_name._M_dataplus._M_p;
        message_06._M_len = prefix_and_full_type_name._M_string_length;
        ReportWarning(this,message_06);
LAB_002c905b:
        std::__cxx11::string::~string((string *)&prefix_and_full_type_name);
        bVar4 = false;
      }
      else {
        bVar5 = Descriptor::IsReservedNumber(pDVar9,(int)serialized_value._M_dataplus._M_p);
        bVar4 = true;
        if (!bVar5) {
          pFVar10 = Descriptor::FindFieldByNumber(pDVar9,(int)serialized_value._M_dataplus._M_p);
          goto LAB_002c8ac5;
        }
      }
LAB_002c9067:
      if (((this->allow_unknown_field_ == false) && (!bVar4)) &&
         ((this->allow_unknown_extension_ & 1U) == 0)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&lower_field_name,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                   ,0x281,0x42,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field")
        ;
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&lower_field_name);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,":",(allocator<char> *)&local_188);
      bVar4 = TryConsumeBeforeWhitespace(this,&lower_field_name);
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (bVar4) {
        TryConsumeWhitespace(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lower_field_name,"{",(allocator<char> *)&local_c0);
        psVar12 = &(this->tokenizer_).current_.text;
        _Var6 = std::operator==(psVar12,&lower_field_name);
        if (_Var6) {
          std::__cxx11::string::~string((string *)&lower_field_name);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188,"<",(allocator<char> *)&full_type_name);
          _Var6 = std::operator==(psVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (!_Var6) {
            bVar4 = SkipFieldValue(this);
            goto LAB_002c93de;
          }
        }
      }
      bVar4 = SkipFieldMessage(this);
      goto LAB_002c93de;
    }
    name._M_str = field_name._M_dataplus._M_p;
    name._M_len = field_name._M_string_length;
    pFVar10 = Descriptor::FindFieldByName(pDVar9,name);
    if (pFVar10 == (FieldDescriptor *)0x0) {
      std::__cxx11::string::string((string *)&lower_field_name,(string *)&field_name);
      absl::lts_20240722::AsciiStrToLower((string *)&lower_field_name);
      name_00._M_str = lower_field_name._M_dataplus._M_p;
      name_00._M_len = lower_field_name._M_string_length;
      pFVar10 = Descriptor::FindFieldByName(pDVar9,name_00);
      if ((pFVar10 == (FieldDescriptor *)0x0) ||
         (bVar4 = internal::cpp::IsGroupLike(pFVar10), !bVar4)) {
        pFVar10 = (FieldDescriptor *)0x0;
      }
      else {
        pDVar8 = FieldDescriptor::message_type(pFVar10);
        bVar4 = std::operator!=(pDVar8->all_names_,&field_name);
        if (bVar4) {
          pFVar10 = (FieldDescriptor *)0x0;
        }
      }
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (pFVar10 == (FieldDescriptor *)0x0) {
        if (this->allow_case_insensitive_field_ == true) {
          std::__cxx11::string::string((string *)&lower_field_name,(string *)&field_name);
          absl::lts_20240722::AsciiStrToLower((string *)&lower_field_name);
          lowercase_name._M_str = lower_field_name._M_dataplus._M_p;
          lowercase_name._M_len = lower_field_name._M_string_length;
          pFVar10 = Descriptor::FindFieldByLowercaseName(pDVar9,lowercase_name);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_002c8ad1;
        }
        name_01._M_str = field_name._M_dataplus._M_p;
        name_01._M_len = field_name._M_string_length;
        bVar5 = Descriptor::IsReservedName(pDVar9,name_01);
        bVar4 = true;
        if (bVar5) goto LAB_002c9067;
        goto LAB_002c8fa1;
      }
    }
LAB_002c8ad1:
    if ((pFVar10->options_->field_0)._impl_.deprecated_ == true) {
      lower_field_name._0_16_ =
           absl::lts_20240722::NullSafeStringView("text format contains deprecated field \"");
      local_188.piece_._M_len = field_name._M_string_length;
      local_188.piece_._M_str = field_name._M_dataplus._M_p;
      local_c0.piece_ = absl::lts_20240722::NullSafeStringView("\"");
      absl::lts_20240722::StrCat_abi_cxx11_
                ((AlphaNum *)&full_type_name,(AlphaNum *)&lower_field_name,&local_188);
      message_03._M_str = full_type_name._M_dataplus._M_p;
      message_03._M_len = full_type_name._M_string_length;
      ReportWarning(this,message_03);
      std::__cxx11::string::~string((string *)&full_type_name);
    }
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      bVar4 = FieldDescriptor::is_repeated(pFVar10);
      if ((!bVar4) && (bVar4 = Reflection::HasField(this_01,message,pFVar10), bVar4)) {
        lower_field_name._0_16_ = absl::lts_20240722::NullSafeStringView("Non-repeated field \"");
        local_188.piece_._M_len = field_name._M_string_length;
        local_188.piece_._M_str = field_name._M_dataplus._M_p;
        local_c0.piece_ = absl::lts_20240722::NullSafeStringView("\" is specified multiple times.");
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)&full_type_name,(AlphaNum *)&lower_field_name,&local_188);
        message_04._M_str = full_type_name._M_dataplus._M_p;
        message_04._M_len = full_type_name._M_string_length;
        ReportError(this,message_04);
        psVar12 = &full_type_name;
        goto LAB_002c92c7;
      }
      oneof_descriptor = FieldDescriptor::containing_oneof(pFVar10);
      if ((oneof_descriptor != (OneofDescriptor *)0x0) &&
         (bVar4 = Reflection::HasOneof(this_01,message,oneof_descriptor), bVar4)) {
        pFVar10 = Reflection::GetOneofFieldDescriptor(this_01,message,oneof_descriptor);
        lower_field_name._0_16_ = absl::lts_20240722::NullSafeStringView("Field \"");
        local_188.piece_._M_len = field_name._M_string_length;
        local_188.piece_._M_str = field_name._M_dataplus._M_p;
        local_c0.piece_ =
             absl::lts_20240722::NullSafeStringView("\" is specified along with field \"");
        full_type_name._M_string_length = (size_type)(pFVar10->all_names_->_M_dataplus)._M_p;
        full_type_name._M_dataplus._M_p = (pointer)pFVar10->all_names_->_M_string_length;
        prefix._0_16_ = absl::lts_20240722::NullSafeStringView("\", another member of oneof \"");
        absl::lts_20240722::StrCat<std::__cxx11::string,char[3]>
                  (&prefix_and_full_type_name,(lts_20240722 *)&lower_field_name,&local_188,&local_c0
                   ,(AlphaNum *)&full_type_name,(AlphaNum *)&prefix,
                   (AlphaNum *)oneof_descriptor->all_names_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x341e91,
                   in_stack_fffffffffffffdf8);
        message_05._M_str = prefix_and_full_type_name._M_dataplus._M_p;
        message_05._M_len = prefix_and_full_type_name._M_string_length;
        ReportError(this,message_05);
        goto LAB_002c92c2;
      }
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar10->type_ * 4) == 10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,":",(allocator<char> *)&local_188);
      bVar4 = TryConsumeBeforeWhitespace(this,&lower_field_name);
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (((!bVar4) ||
          (TryConsumeWhitespace(this), (pFVar10->options_->field_0)._impl_.weak_ != true)) ||
         ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_002c8e1b;
      lower_field_name._M_string_length = 0;
      lower_field_name._M_dataplus._M_p = (pointer)&lower_field_name.field_2;
      lower_field_name.field_2._M_local_buf[0] = '\0';
      bVar4 = ConsumeString(this,&lower_field_name);
      if (!bVar4) {
        psVar12 = &lower_field_name;
        goto LAB_002c92c7;
      }
      pFVar2 = this->finder_;
      if (pFVar2 == (Finder *)0x0) {
        factory = (MessageFactory *)0x0;
      }
      else {
        iVar7 = (*pFVar2->_vptr_Finder[5])(pFVar2,pFVar10);
        factory = (MessageFactory *)CONCAT44(extraout_var_02,iVar7);
      }
      this_00 = &Reflection::MutableMessage(this_01,message,pFVar10,factory)->super_MessageLite;
      data._M_str = lower_field_name._M_dataplus._M_p;
      data._M_len = lower_field_name._M_string_length;
      MessageLite::ParseFromString(this_00,data);
      std::__cxx11::string::~string((string *)&lower_field_name);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lower_field_name,":",(allocator<char> *)&local_188);
      bVar4 = ConsumeBeforeWhitespace(this,&lower_field_name);
      std::__cxx11::string::~string((string *)&lower_field_name);
      if (!bVar4) goto LAB_002c92cc;
      TryConsumeWhitespace(this);
LAB_002c8e1b:
      bVar4 = FieldDescriptor::is_repeated(pFVar10);
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lower_field_name,"[",(allocator<char> *)&local_188);
        bVar4 = TryConsume(this,&lower_field_name);
        std::__cxx11::string::~string((string *)&lower_field_name);
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lower_field_name,"]",(allocator<char> *)&local_188);
          bVar4 = TryConsume(this,&lower_field_name);
          std::__cxx11::string::~string((string *)&lower_field_name);
          if (!bVar4) {
            do {
              if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar10->type_ * 4) == 10) {
                bVar4 = ConsumeFieldMessage(this,message,this_01,pFVar10);
              }
              else {
                bVar4 = ConsumeFieldValue(this,message,this_01,pFVar10);
              }
              if (bVar4 == false) goto LAB_002c92cc;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&lower_field_name,"]",(allocator<char> *)&local_188);
              bVar4 = TryConsume(this,&lower_field_name);
              std::__cxx11::string::~string((string *)&lower_field_name);
              if (bVar4) goto LAB_002c942a;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&lower_field_name,",",(allocator<char> *)&local_188);
              bVar5 = Consume(this,&lower_field_name);
              std::__cxx11::string::~string((string *)&lower_field_name);
              bVar4 = false;
            } while (bVar5);
            goto LAB_002c93de;
          }
          goto LAB_002c942a;
        }
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar10->type_ * 4) == 10) {
        bVar4 = ConsumeFieldMessage(this,message,this_01,pFVar10);
      }
      else {
        bVar4 = ConsumeFieldValue(this,message,this_01,pFVar10);
      }
      if (bVar4 == false) goto LAB_002c92cc;
    }
LAB_002c942a:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lower_field_name,";",(allocator<char> *)&local_c0);
    bVar4 = TryConsume(this,&lower_field_name);
    if (!bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,",",(allocator<char> *)&full_type_name);
      TryConsume(this,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
    }
    std::__cxx11::string::~string((string *)&lower_field_name);
    bVar4 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      range.end.column = (this->tokenizer_).previous_.end_column;
      range.end.line = (this->tokenizer_).previous_.line;
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar10,range);
    }
  }
LAB_002c93de:
  std::__cxx11::string::~string((string *)&field_name);
  return bVar4;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }